

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGBA,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  EBlend EVar5;
  FSpecialColormap *pFVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  
  pFVar6 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004dacc1_caseD_0:
    lVar13 = 0;
    if (count < 1) {
      count = 0;
    }
    pbVar15 = pin + 3;
    for (; count != (int)lVar13; lVar13 = lVar13 + 1) {
      bVar1 = *pbVar15;
      if (bVar1 != 0) {
        uVar11 = (uint)bVar1;
        uVar7 = uVar11 ^ 0xff;
        pout[lVar13 * 4 + 2] =
             (BYTE)((ulong)(pout[lVar13 * 4 + 2] * uVar7 + pbVar15[-3] * uVar11) / 0xff);
        pout[lVar13 * 4 + 1] =
             (BYTE)((ulong)(pout[lVar13 * 4 + 1] * uVar7 + pbVar15[-2] * uVar11) / 0xff);
        pout[lVar13 * 4] = (BYTE)((ulong)(pout[lVar13 * 4] * uVar7 + pbVar15[-1] * uVar11) / 0xff);
        pout[lVar13 * 4 + 3] = bVar1;
      }
      pbVar15 = pbVar15 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004dacc1_caseD_0;
    case BLEND_ICEMAP:
      lVar13 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar13; lVar13 = lVar13 + 1) {
        bVar1 = pin[3];
        if (bVar1 != 0) {
          iVar8 = cRGBA::Gray(pin);
          iVar8 = iVar8 >> 4;
          uVar7 = (uint)bVar1;
          uVar11 = uVar7 ^ 0xff;
          pout[lVar13 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar13 * 4 + 2] * uVar11 + IcePalette[iVar8][0] * uVar7) / 0xff);
          pout[lVar13 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar13 * 4 + 1] * uVar11 + IcePalette[iVar8][1] * uVar7) / 0xff);
          pout[lVar13 * 4] =
               (BYTE)((ulong)(pout[lVar13 * 4] * uVar11 + IcePalette[iVar8][2] * uVar7) / 0xff);
          pout[lVar13 * 4 + 3] = bVar1;
        }
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar13 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar15 = pin + 3;
      for (; count != (int)lVar13; lVar13 = lVar13 + 1) {
        bVar1 = *pbVar15;
        if (bVar1 != 0) {
          iVar8 = inf->blendcolor[3];
          bVar2 = pbVar15[-2];
          iVar9 = inf->blendcolor[1];
          bVar3 = pbVar15[-1];
          iVar4 = inf->blendcolor[2];
          uVar7 = (uint)bVar1;
          uVar11 = uVar7 ^ 0xff;
          pout[lVar13 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar13 * 4 + 2] * uVar11 +
                             ((uint)pbVar15[-3] * iVar8 + inf->blendcolor[0] >> 0x10 & 0xff) * uVar7
                             ) / 0xff);
          pout[lVar13 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar13 * 4 + 1] * uVar11 +
                             ((uint)bVar2 * iVar8 + iVar9 >> 0x10 & 0xff) * uVar7) / 0xff);
          pout[lVar13 * 4] =
               (BYTE)((ulong)(pout[lVar13 * 4] * uVar11 +
                             ((uint)bVar3 * iVar8 + iVar4 >> 0x10 & 0xff) * uVar7) / 0xff);
          pout[lVar13 * 4 + 3] = bVar1;
        }
        pbVar15 = pbVar15 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar13 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar15 = pin + 3;
      for (; count != (int)lVar13; lVar13 = lVar13 + 1) {
        bVar1 = *pbVar15;
        if (bVar1 != 0) {
          bVar2 = pbVar15[-2];
          iVar8 = inf->blendcolor[1];
          bVar3 = pbVar15[-1];
          iVar9 = inf->blendcolor[2];
          uVar7 = (uint)bVar1;
          uVar11 = uVar7 ^ 0xff;
          pout[lVar13 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar13 * 4 + 2] * uVar11 +
                             ((uint)pbVar15[-3] * inf->blendcolor[0] >> 0x10 & 0xff) * uVar7) / 0xff
                     );
          pout[lVar13 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar13 * 4 + 1] * uVar11 +
                             ((uint)bVar2 * iVar8 >> 0x10 & 0xff) * uVar7) / 0xff);
          pout[lVar13 * 4] =
               (BYTE)((ulong)(pout[lVar13 * 4] * uVar11 +
                             ((uint)bVar3 * iVar9 >> 0x10 & 0xff) * uVar7) / 0xff);
          pout[lVar13 * 4 + 3] = bVar1;
        }
        pbVar15 = pbVar15 + step;
      }
      break;
    default:
      EVar5 = inf->blend;
      lVar13 = (long)EVar5;
      if (lVar13 < 0x21) {
        if (BLEND_ICEMAP < EVar5) {
          iVar8 = 0x20 - EVar5;
          uVar12 = 0;
          uVar10 = (ulong)(uint)count;
          if (count < 1) {
            uVar10 = uVar12;
          }
          for (; (int)uVar10 != (int)uVar12; uVar12 = uVar12 + 1) {
            bVar1 = pin[3];
            if (bVar1 != 0) {
              iVar9 = cRGBA::Gray(pin);
              iVar9 = iVar9 * (EVar5 + BLEND_MODULATE);
              bVar2 = pin[1];
              bVar3 = pin[2];
              uVar11 = (uint)bVar1;
              uVar7 = uVar11 ^ 0xff;
              pout[uVar12 * 4 + 2] =
                   (BYTE)((ulong)(pout[uVar12 * 4 + 2] * uVar7 +
                                 ((int)((uint)*pin * iVar8 + iVar9) / 0x1f & 0xffU) * uVar11) / 0xff
                         );
              pout[uVar12 * 4 + 1] =
                   (BYTE)((ulong)(pout[uVar12 * 4 + 1] * uVar7 +
                                 ((int)((uint)bVar2 * iVar8 + iVar9) / 0x1f & 0xffU) * uVar11) /
                         0xff);
              pout[uVar12 * 4] =
                   (BYTE)((ulong)(pout[uVar12 * 4] * uVar7 +
                                 ((int)((uint)bVar3 * iVar8 + iVar9) / 0x1f & 0xffU) * uVar11) /
                         0xff);
              pout[uVar12 * 4 + 3] = bVar1;
            }
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar14 = 0; count != (int)lVar14; lVar14 = lVar14 + 1) {
          bVar1 = pin[3];
          if (bVar1 != 0) {
            uVar7 = cRGBA::Gray(pin);
            uVar11 = 0xff;
            if (uVar7 < 0xff) {
              uVar11 = uVar7;
            }
            if ((int)uVar7 < 1) {
              uVar11 = 0;
            }
            uVar10 = (ulong)uVar11;
            bVar2 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar13 * 0x518 + -0xa700);
            bVar3 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar13 * 0x518 + -0xa6ff);
            uVar11 = (uint)bVar1;
            uVar7 = uVar11 ^ 0xff;
            pout[lVar14 * 4 + 2] =
                 (BYTE)((ulong)(pout[lVar14 * 4 + 2] * uVar7 +
                               *(byte *)((long)pFVar6 + uVar10 * 4 + lVar13 * 0x518 + -0xa6fe) *
                               uVar11) / 0xff);
            pout[lVar14 * 4 + 1] =
                 (BYTE)((ulong)(pout[lVar14 * 4 + 1] * uVar7 + bVar3 * uVar11) / 0xff);
            pout[lVar14 * 4] = (BYTE)((ulong)(pout[lVar14 * 4] * uVar7 + bVar2 * uVar11) / 0xff);
            pout[lVar14 * 4 + 3] = bVar1;
          }
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}